

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O1

HRESULT __thiscall
NativeCodeGenerator::JitFromEncodedWorkItem(NativeCodeGenerator *this,byte *buffer,uint bufferSize)

{
  return -0x7fffbfff;
}

Assistant:

HRESULT NativeCodeGenerator::JitFromEncodedWorkItem(_In_reads_(bufferSize) const byte* buffer, _In_ uint bufferSize)
{
    CodeGenWorkItemIDL* workItemData = nullptr;
    HRESULT hr = JITManager::DeserializeRPCData(buffer, bufferSize, &workItemData);
    if (FAILED(hr))
    {
        return hr;
    }
    AssertOrFailFast(workItemData);
    JITOutputIDL jitOutput = { 0 };
    CodeGen(scriptContext->GetThreadContext()->GetPageAllocator(), workItemData, jitOutput, true);
    return S_OK;
}